

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall Liby::Logger::logger_thread(Logger *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> logStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  do {
    do {
      BlockingQueue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pop_wait(&local_40,&this->queue_);
      if (local_40._M_string_length != 0) {
        fwrite(local_40._M_dataplus._M_p,local_40._M_string_length,1,_stderr);
      }
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_40._M_dataplus._M_p == &local_40.field_2);
    operator_delete(local_40._M_dataplus._M_p);
  } while( true );
}

Assistant:

void Logger::logger_thread() {
    int64_t bytes = 0;
    //    ::alarm(1);
    //    Signal::signal(SIGALRM, [&bytes] {
    //        std::cout << "write " << bytes / (1024 * 1024) << " MB" <<
    //        std::endl;
    //        bytes = 0;
    //        ::alarm(1);
    //    });
    while (1) {
        auto logStr = queue_.pop_wait();
        if (logStr.empty())
            continue;
        bytes += logStr.size();
        ::fwrite(logStr.data(), logStr.size(), 1, stderr);
    }
}